

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Impl::loadFinal(Impl *this,SchemaLoader *loader,uint64_t id)

{
  Node *node;
  Node *local_28;
  Node *_node1313;
  uint64_t id_local;
  SchemaLoader *loader_local;
  Impl *this_local;
  
  _node1313 = (Node *)id;
  id_local = (uint64_t)loader;
  loader_local = (SchemaLoader *)this;
  findNode((Impl *)&node,(uint64_t)this);
  local_28 = kj::_::readMaybe<capnp::compiler::Compiler::Node>
                       ((Maybe<capnp::compiler::Compiler::Node_&> *)&node);
  if (local_28 != (Node *)0x0) {
    Node::loadFinalSchema(local_28,(SchemaLoader *)id_local);
  }
  return;
}

Assistant:

void Compiler::Impl::loadFinal(const SchemaLoader& loader, uint64_t id) {
  KJ_IF_SOME(node, findNode(id)) {
    node.loadFinalSchema(loader);
  }
}